

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cc
# Opt level: O1

void __thiscall test_apply_endian_swap::test_method(test_apply_endian_swap *this)

{
  int i;
  PluginManager *pPVar1;
  long *plVar2;
  long lVar3;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  int i_1;
  B *pBVar7;
  int j_1;
  int j;
  long lVar8;
  int iVar9;
  int i_2;
  float fVar10;
  float local_d9c;
  B *local_d98;
  float *local_d90;
  B *local_d88;
  ulong uStack_d80;
  undefined8 *local_d78;
  B **local_d70;
  string *local_d68;
  ulong uStack_d60;
  undefined8 *local_d58;
  float **local_d50;
  undefined1 local_d48 [8];
  undefined8 local_d40;
  shared_count sStack_d38;
  long *local_d30;
  char *local_d28;
  char *local_d20;
  undefined **local_d18;
  undefined1 local_d10;
  undefined8 *local_d08;
  char *local_d00;
  code *local_cf8;
  CompileEndianSwapVisitor compiled;
  void *local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  long local_cc8;
  B *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  Registry registry;
  config_set config;
  B swapped_b;
  undefined8 **local_560;
  uint local_558;
  undefined1 local_554;
  undefined2 local_552;
  undefined8 *local_550;
  char *local_548;
  undefined4 local_3c0;
  undefined1 local_360 [816];
  
  Typelib::Registry::Registry(&registry);
  utilmm::singleton::wrapper<Typelib::PluginManager>::attach();
  pPVar1 = utilmm::singleton::wrapper<Typelib::PluginManager>::instance();
  local_560 = &local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"tlb","");
  plVar2 = (long *)Typelib::PluginManager::importer((string *)pPVar1);
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  utilmm::config_set::config_set(&config,(config_set *)0x0);
  local_d30 = plVar2;
  local_560 = &local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_cimport.tlb"
             ,"");
  (**(code **)(*plVar2 + 0x18))(plVar2,&local_560,&config,&registry);
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_b80 = "";
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b88,0xf4);
  swapped_b.a.a = CONCAT71(swapped_b.a.a._1_7_,1);
  swapped_b.a.b = 0;
  swapped_b.a.c = '\0';
  swapped_b.a._13_1_ = 0;
  swapped_b.a.d = 0;
  swapped_b.c[0] = 0.0;
  swapped_b.c[1] = 0.0;
  local_558 = local_558 & 0xffffff00;
  local_560 = (undefined8 **)&PTR__lazy_ostream_001852c0;
  local_550 = &boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "no exceptions thrown by importer->load(\"/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/\" \"test_cimport.tlb\", config, registry)"
  ;
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_ba0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)swapped_b.c);
  local_560 = (undefined8 **)0xa00000000000000;
  local_558 = 0x14000000;
  local_554 = 0x62;
  local_552 = 0x3400;
  lVar3 = 0;
  do {
    fVar10 = (float)(int)lVar3 / 10.0;
    *(uint *)((long)&local_550 + lVar3 * 4) =
         (uint)fVar10 >> 0x18 | ((uint)fVar10 & 0xff0000) >> 8 | ((uint)fVar10 & 0xff00) << 8 |
         (int)fVar10 << 0x18;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  puVar4 = local_360;
  local_3c0 = 0x2842;
  iVar9 = 0;
  lVar3 = 0;
  do {
    lVar8 = 0;
    do {
      fVar10 = (float)(iVar9 + (int)lVar8);
      *(uint *)(puVar4 + lVar8 * 4) =
           (uint)fVar10 >> 0x18 | ((uint)fVar10 & 0xff0000) >> 8 | ((uint)fVar10 & 0xff00) << 8 |
           (int)fVar10 << 0x18;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 10);
    lVar3 = lVar3 + 1;
    iVar9 = iVar9 + 100;
    puVar4 = puVar4 + 0x50;
  } while (lVar3 != 10);
  pBVar7 = (B *)swapped_b.c;
  swapped_b.a.a = (longlong)pBVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&swapped_b,"/B","");
  uVar5 = Typelib::Registry::get((string *)&registry);
  if ((B *)swapped_b.a.a != pBVar7) {
    operator_delete((void *)swapped_b.a.a);
  }
  _compiled = (code *)&local_ce0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&compiled,"/B","");
  uVar6 = Typelib::Registry::get((string *)&registry);
  if ((void **)_compiled != &local_ce0) {
    operator_delete(_compiled);
  }
  local_cf8 = boost::test_tools::tt_detail::report_assertion;
  _compiled = boost::test_tools::tt_detail::report_assertion;
  local_ce0 = (void *)0x0;
  uStack_cd8 = 0;
  local_cd0 = 0;
  Typelib::CompileEndianSwapVisitor::apply((Type *)&compiled);
  local_d88 = &swapped_b;
  uStack_d80 = uVar6;
  local_d68 = (string *)&local_560;
  uStack_d60 = uVar5;
  Typelib::CompileEndianSwapVisitor::swap(&compiled,0,0,local_ce0,uStack_cd8);
  local_be8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_be0 = "";
  local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_be8,0x10f);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_00184370;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d90 = &local_d9c;
  local_d9c = 1.4013e-44;
  local_d48[0] = swapped_b.a.a == 10;
  local_d40 = 0;
  sStack_d38.pi_ = (sp_counted_base *)0x0;
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d50 = &local_d90;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_001846b0;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_00185720;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d98 = &swapped_b;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d38);
  local_c08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c00 = "";
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c08,0x110);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_00184370;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d98 = (B *)&swapped_b.a.b;
  local_d48[0] = swapped_b.a.b == 0x14;
  local_d9c = 2.8026e-44;
  local_d40 = 0;
  sStack_d38.pi_ = (sp_counted_base *)0x0;
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d90 = &local_d9c;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_001846b0;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d50 = &local_d90;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_001846b0;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d38);
  local_c28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c20 = "";
  local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c28,0x111);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_00184370;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d9c = (float)CONCAT31(local_d9c._1_3_,0x62);
  local_d98 = (B *)&swapped_b.a.c;
  local_d48[0] = swapped_b.a.c == 'b';
  local_d40 = 0;
  sStack_d38.pi_ = (sp_counted_base *)0x0;
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d90 = &local_d9c;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_00185760;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d50 = &local_d90;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_00185760;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d38);
  local_c48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c40 = "";
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c48,0x112);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_00184370;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d9c = 7.28675e-44;
  local_d98 = (B *)&swapped_b.a.d;
  local_d48[0] = swapped_b.a.d == 0x34;
  local_d40 = 0;
  sStack_d38.pi_ = (sp_counted_base *)0x0;
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d90 = &local_d9c;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_001846b0;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d50 = &local_d90;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_001857a0;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d38);
  lVar3 = 0;
  do {
    local_c88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
    ;
    local_c80 = "";
    local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c88,0x114,&local_c98);
    local_d10 = 0;
    local_d18 = &PTR__lazy_ostream_00184370;
    local_d08 = &boost::unit_test::lazy_ostream::inst;
    local_d00 = "";
    local_d9c = (float)(int)lVar3 / 10.0;
    local_d48[0] = local_d9c == *(float *)&(pBVar7->a).a;
    local_d40 = 0;
    sStack_d38.pi_ = (sp_counted_base *)0x0;
    local_d28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
    ;
    local_d20 = "";
    local_d90 = &local_d9c;
    uStack_d60 = uStack_d60 & 0xffffffffffffff00;
    local_d68 = (string *)&PTR__lazy_ostream_00184b80;
    local_d58 = &boost::unit_test::lazy_ostream::inst;
    local_d50 = &local_d90;
    uStack_d80 = uStack_d80 & 0xffffffffffffff00;
    local_d88 = (B *)&PTR__lazy_ostream_00184b80;
    local_d78 = &boost::unit_test::lazy_ostream::inst;
    local_d70 = &local_d98;
    local_d98 = pBVar7;
    boost::test_tools::tt_detail::report_assertion
              (local_d48,&local_d18,&local_d28,0x114,2,2,2,"static_cast<float>(i) / 10.0f",
               &local_d68,"swapped_b.c[i]",&local_d88);
    boost::detail::shared_count::~shared_count(&sStack_d38);
    lVar3 = lVar3 + 1;
    pBVar7 = (B *)((long)&(pBVar7->a).a + 4);
  } while (lVar3 != 10);
  local_c68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c60 = "";
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c68,0x115);
  local_d10 = 0;
  local_d18 = &PTR__lazy_ostream_00184370;
  local_d08 = &boost::unit_test::lazy_ostream::inst;
  local_d00 = "";
  local_d9c = 5.88545e-44;
  local_d98 = (B *)swapped_b.d;
  local_d48[0] = swapped_b.d[0] == 42.0;
  local_d40 = 0;
  sStack_d38.pi_ = (sp_counted_base *)0x0;
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_d20 = "";
  local_d90 = &local_d9c;
  uStack_d60 = uStack_d60 & 0xffffffffffffff00;
  local_d68 = (string *)&PTR__lazy_ostream_001846b0;
  local_d58 = &boost::unit_test::lazy_ostream::inst;
  local_d50 = &local_d90;
  uStack_d80 = uStack_d80 & 0xffffffffffffff00;
  local_d88 = (B *)&PTR__lazy_ostream_00184b80;
  local_d78 = &boost::unit_test::lazy_ostream::inst;
  local_d70 = &local_d98;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d38);
  pBVar7 = (B *)swapped_b.i;
  iVar9 = 0;
  lVar3 = 0;
  do {
    lVar8 = 0;
    local_cc8 = lVar3;
    local_cc0 = pBVar7;
    do {
      local_ca8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
      ;
      local_ca0 = "";
      local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_ca8,0x118,&local_cb8)
      ;
      local_d9c = (float)(iVar9 + (int)lVar8);
      local_d48[0] = (float)(int)local_d9c == *(float *)&(pBVar7->a).a;
      local_d10 = 0;
      local_d18 = &PTR__lazy_ostream_00184370;
      local_d08 = &boost::unit_test::lazy_ostream::inst;
      local_d00 = "";
      local_d40 = 0;
      sStack_d38.pi_ = (sp_counted_base *)0x0;
      local_d28 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
      ;
      local_d20 = "";
      local_d90 = &local_d9c;
      uStack_d60 = uStack_d60 & 0xffffffffffffff00;
      local_d68 = (string *)&PTR__lazy_ostream_001846b0;
      local_d58 = &boost::unit_test::lazy_ostream::inst;
      local_d50 = &local_d90;
      uStack_d80 = uStack_d80 & 0xffffffffffffff00;
      local_d88 = (B *)&PTR__lazy_ostream_00184b80;
      local_d78 = &boost::unit_test::lazy_ostream::inst;
      local_d70 = &local_d98;
      local_d98 = pBVar7;
      boost::test_tools::tt_detail::report_assertion
                (local_d48,&local_d18,&local_d28,0x118,2,2,2,"i * 100 + j",&local_d68,
                 "swapped_b.i[i][j]",&local_d88);
      boost::detail::shared_count::~shared_count(&sStack_d38);
      lVar8 = lVar8 + 1;
      pBVar7 = (B *)((long)&(pBVar7->a).a + 4);
    } while (lVar8 != 10);
    lVar3 = local_cc8 + 1;
    iVar9 = iVar9 + 100;
    pBVar7 = (B *)(*(float (*) [20])local_cc0->c + 0x10);
  } while (lVar3 != 10);
  _compiled = local_cf8;
  if (local_ce0 != (void *)0x0) {
    operator_delete(local_ce0);
  }
  utilmm::config_set::~config_set(&config);
  if (local_d30 != (long *)0x0) {
    (**(code **)(*local_d30 + 8))();
  }
  utilmm::singleton::wrapper<Typelib::PluginManager>::detach();
  Typelib::Registry::~Registry(&registry);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_apply_endian_swap )
{
    // Get the test file into repository
    Registry registry;
    PluginManager::self manager;
    unique_ptr<Importer> importer(manager->importer("tlb"));
    utilmm::config_set config;
    BOOST_REQUIRE_NO_THROW( importer->load(TEST_DATA_PATH("test_cimport.tlb"), config, registry) );

    A a = {
        Endian::swap((long long)10),
        Endian::swap((int)20),
        Endian::swap('b'),
        Endian::swap((short)52)
    };
    B b;
    b.a = a;
    for (int i = 0; i < 10; ++i)
        b.c[i] = Endian::swap(static_cast<float>(i) / 10.0f);

    b.d[0] = Endian::swap<float>(42);

    for (int i = 0; i < 10; ++i)
        for (int j = 0; j < 10; ++j)
            b.i[i][j] = Endian::swap<float>(i * 100 + j);

    Value v_b(&b, *registry.get("/B"));
    B swapped_b;
    Value v_swapped_b(&swapped_b, *registry.get("/B"));

    CompileEndianSwapVisitor compiled;
    compiled.apply(v_b.getType());
    compiled.swap(v_b, v_swapped_b);

    BOOST_REQUIRE_EQUAL(10, swapped_b.a.a);
    BOOST_REQUIRE_EQUAL(20, swapped_b.a.b);
    BOOST_REQUIRE_EQUAL('b', swapped_b.a.c);
    BOOST_REQUIRE_EQUAL(52, swapped_b.a.d);
    for (int i = 0; i < 10; ++i)
        BOOST_REQUIRE_EQUAL(static_cast<float>(i) / 10.0f, swapped_b.c[i]);
    BOOST_REQUIRE_EQUAL(42, swapped_b.d[0]);
    for (int i = 0; i < 10; ++i)
        for (int j = 0; j < 10; ++j)
            BOOST_REQUIRE_EQUAL(i * 100 + j, swapped_b.i[i][j]);
}